

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

void memory_tree_ns::single_query_and_learn
               (memory_tree *b,single_learner *base,uint32_t *ec_array_index,example *ec)

{
  undefined4 uVar1;
  uint uVar2;
  size_t sVar3;
  uint *puVar4;
  node *pnVar5;
  v_array<unsigned_int> *in_RCX;
  learner<char,_example> *in_RDI;
  float fVar6;
  float fVar7;
  double dVar8;
  double dVar9;
  float weight_1;
  labels preds;
  labels multilabels;
  label_t mc;
  float ec_input_weight;
  float reward_right_subtree;
  float reward_left_subtree;
  float weight;
  float coin;
  float prob_right;
  float objective;
  uint32_t cn;
  uint32_t random_pos;
  v_array<unsigned_int> path_to_leaf;
  v_array<unsigned_int> *in_stack_fffffffffffffec0;
  undefined4 uVar10;
  undefined4 uVar11;
  learner<char,_example> *in_stack_fffffffffffffed0;
  float *in_stack_fffffffffffffef0;
  example *in_stack_fffffffffffffef8;
  uint32_t *in_stack_ffffffffffffff00;
  single_learner *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff3c;
  undefined1 insertion;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  uint32_t in_stack_ffffffffffffff4c;
  uint *in_stack_ffffffffffffff50;
  example *in_stack_ffffffffffffff58;
  memory_tree *in_stack_ffffffffffffff60;
  example *in_stack_ffffffffffffff68;
  memory_tree *in_stack_ffffffffffffff70;
  single_learner *in_stack_ffffffffffffff78;
  memory_tree *in_stack_ffffffffffffff80;
  uint *local_78;
  uint *local_6c;
  float local_4c;
  v_array<unsigned_int> local_40;
  v_array<unsigned_int> *local_20;
  learner<char,_example> *local_8;
  
  insertion = (undefined1)((uint)in_stack_ffffffffffffff3c >> 0x18);
  local_20 = in_RCX;
  local_8 = in_RDI;
  v_init<unsigned_int>();
  route_to_leaf(in_stack_ffffffffffffff60,(single_learner *)in_stack_ffffffffffffff58,
                in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
                (v_array<unsigned_int> *)
                CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),(bool)insertion);
  sVar3 = v_array<unsigned_int>::size(&local_40);
  if (1 < sVar3) {
    fVar6 = merand48((uint64_t *)in_stack_fffffffffffffec0);
    sVar3 = v_array<unsigned_int>::size(&local_40);
    puVar4 = v_array<unsigned_int>::operator[](&local_40,(long)(fVar6 * (float)sVar3) & 0xffffffff);
    uVar2 = *puVar4;
    pnVar5 = v_array<memory_tree_ns::node>::operator[]
                       ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)uVar2);
    if (pnVar5->internal == -1) {
      if (*(int *)(local_8 + 0xac) == 1) {
        learn_at_leaf_random
                  ((memory_tree *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                   in_stack_fffffffffffffef0);
      }
      if (*(int *)(local_8 + 0xcc) == 1) {
        train_one_against_some_at_leaf
                  (in_stack_ffffffffffffff70,(single_learner *)in_stack_ffffffffffffff68,
                   (uint32_t)((ulong)in_stack_ffffffffffffff60 >> 0x20),in_stack_ffffffffffffff58);
      }
    }
    else {
      fVar6 = merand48((uint64_t *)in_stack_fffffffffffffec0);
      fVar6 = *(float *)(&DAT_00492b10 + (ulong)(fVar6 < 0.5) * 4);
      v_array<unsigned_int>::size(&local_40);
      v_array<unsigned_int>::size(&local_40);
      if ((fVar6 != -1.0) || (NAN(fVar6))) {
        in_stack_fffffffffffffed0 = local_8;
        v_array<memory_tree_ns::node>::operator[]
                  ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)uVar2);
        fVar7 = return_reward_from_node
                          (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                           (uint32_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                           in_stack_ffffffffffffff68,
                           (float)((ulong)in_stack_ffffffffffffff60 >> 0x20));
        fVar6 = *(float *)(local_8 + 0x70);
        pnVar5 = v_array<memory_tree_ns::node>::operator[]
                           ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)uVar2);
        dVar9 = pnVar5->nl;
        pnVar5 = v_array<memory_tree_ns::node>::operator[]
                           ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)uVar2);
        dVar9 = log(dVar9 / pnVar5->nr);
        dVar9 = (1.0 - (double)fVar6) * dVar9 +
                (double)(*(float *)(local_8 + 0x70) * (fVar7 / 0.5)) / 2.0;
      }
      else {
        v_array<memory_tree_ns::node>::operator[]
                  ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)uVar2);
        fVar6 = return_reward_from_node
                          (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                           (uint32_t)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                           in_stack_ffffffffffffff68,
                           (float)((ulong)in_stack_ffffffffffffff60 >> 0x20));
        dVar8 = 1.0 - (double)*(float *)(local_8 + 0x70);
        pnVar5 = v_array<memory_tree_ns::node>::operator[]
                           ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)uVar2);
        dVar9 = pnVar5->nl;
        pnVar5 = v_array<memory_tree_ns::node>::operator[]
                           ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)uVar2);
        dVar9 = log(dVar9 / pnVar5->nr);
        dVar9 = dVar8 * dVar9 + ((double)*(float *)(local_8 + 0x70) * ((double)-fVar6 / 0.5)) / 2.0;
      }
      local_4c = (float)dVar9;
      uVar1 = *(undefined4 *)&local_20[0x343].end_array;
      if (*(int *)(local_8 + 0xcc) == 0) {
        local_6c = local_20[0x341]._end;
      }
      else {
        in_stack_ffffffffffffff70 = (memory_tree *)local_20[0x341]._end;
        in_stack_ffffffffffffff78 = (single_learner *)local_20[0x341].end_array;
        in_stack_ffffffffffffff80 = (memory_tree *)local_20[0x341].erase_count;
        local_78 = local_20[0x342]._begin;
        in_stack_ffffffffffffff50 = local_20[0x342].end_array;
        in_stack_ffffffffffffff58 = (example *)local_20[0x342].erase_count;
        in_stack_ffffffffffffff60 = (memory_tree *)local_20[0x343]._begin;
        in_stack_ffffffffffffff68 = (example *)local_20[0x343]._end;
      }
      dVar9 = std::fabs((double)(ulong)(uint)local_4c);
      *(int *)&local_20[0x343].end_array = SUB84(dVar9,0);
      if (*(float *)&local_20[0x343].end_array < 100.0) {
        if (*(float *)&local_20[0x343].end_array <= 0.01 &&
            *(float *)&local_20[0x343].end_array != 0.01) {
          *(undefined4 *)&local_20[0x343].end_array = 0x3c23d70a;
        }
      }
      else {
        *(undefined4 *)&local_20[0x343].end_array = 0x42c80000;
      }
      uVar10 = 0x3f800000;
      uVar11 = 0xbf800000;
      if (0.0 <= local_4c) {
        uVar11 = 0x3f800000;
      }
      local_20[0x341]._end = (uint *)CONCAT44(0x3f800000,uVar11);
      *(undefined4 *)&local_20[0x341].end_array = 0;
      in_stack_fffffffffffffec0 = local_20;
      v_array<memory_tree_ns::node>::operator[]
                ((v_array<memory_tree_ns::node> *)(local_8 + 8),(ulong)uVar2);
      LEARNER::learner<char,_example>::learn
                (in_stack_fffffffffffffed0,(example *)CONCAT44(uVar11,uVar10),
                 (size_t)in_stack_fffffffffffffec0);
      if (*(int *)(local_8 + 0xcc) == 0) {
        local_20[0x341]._end = local_6c;
      }
      else {
        local_20[0x342].end_array = in_stack_ffffffffffffff50;
        local_20[0x342].erase_count = (size_t)in_stack_ffffffffffffff58;
        local_20[0x343]._begin = (uint *)in_stack_ffffffffffffff60;
        local_20[0x343]._end = (uint *)in_stack_ffffffffffffff68;
        local_20[0x341]._end = (uint *)in_stack_ffffffffffffff70;
        local_20[0x341].end_array = (uint *)in_stack_ffffffffffffff78;
        local_20[0x341].erase_count = (size_t)in_stack_ffffffffffffff80;
        local_20[0x342]._begin = local_78;
      }
      *(undefined4 *)&local_20[0x343].end_array = uVar1;
    }
  }
  v_array<unsigned_int>::delete_v(in_stack_fffffffffffffec0);
  return;
}

Assistant:

void single_query_and_learn(memory_tree& b, single_learner& base, const uint32_t& ec_array_index, example& ec){
        v_array<uint32_t> path_to_leaf = v_init<uint32_t>();
		route_to_leaf(b, base, ec_array_index, 0, path_to_leaf, false); //no insertion happens here.

        if (path_to_leaf.size() > 1){
            //uint32_t random_pos = merand48(b.all->random_state)*(path_to_leaf.size()-1);
            uint32_t random_pos = merand48(b.all->random_state)*(path_to_leaf.size()); //include leaf
            uint32_t cn = path_to_leaf[random_pos];
            
            if (b.nodes[cn].internal != -1){ //if it's an internal node:' 
                float objective = 0.f;
                float prob_right = 0.5;
                float coin = merand48(b.all->random_state) < prob_right ? 1.f : -1.f;
                float weight = path_to_leaf.size()*1.f/(path_to_leaf.size() - 1.f);
                if (coin == -1.f){ //go left
                    float reward_left_subtree = return_reward_from_node(b,base, b.nodes[cn].left, ec, weight);
                    objective = (1.-b.alpha)*log(b.nodes[cn].nl/b.nodes[cn].nr) + b.alpha*(-reward_left_subtree/(1.-prob_right))/2.;
                }
                else{ //go right:
                    float reward_right_subtree= return_reward_from_node(b,base, b.nodes[cn].right, ec, weight);
                    objective = (1.-b.alpha)*log(b.nodes[cn].nl/b.nodes[cn].nr) + b.alpha*(reward_right_subtree/prob_right)/2.;
                }
                
                float ec_input_weight = ec.weight;
                
                MULTICLASS::label_t mc;
                MULTILABEL::labels multilabels;
                MULTILABEL::labels preds;
                if (b.oas == false)
                    mc = ec.l.multi;
                else{
                    multilabels = ec.l.multilabels;
                    preds = ec.pred.multilabels;
                }
                
                ec.weight = fabs(objective);
                if (ec.weight >= 100.f) //crop the weight, otherwise sometimes cause NAN outputs.
                    ec.weight = 100.f;
                else if (ec.weight < .01f)
                    ec.weight = 0.01f;
                ec.l.simple = {objective < 0. ? -1.f : 1.f, 1.f, 0.};
                base.learn(ec, b.nodes[cn].base_router);
               
                if (b.oas == false)
                    ec.l.multi = mc;
                else{
                    ec.pred.multilabels = preds;
                    ec.l.multilabels = multilabels;
                }
                ec.weight = ec_input_weight; //restore the original weight
            }
            else{ //if it's a leaf node:
                float weight = 1.f; //float(path_to_leaf.size());
                if (b.learn_at_leaf == true)
                    learn_at_leaf_random(b, base, cn, ec, weight); //randomly sample one example, query reward, and update leaf learner

                if (b.oas == true)
                    train_one_against_some_at_leaf(b,base, cn, ec);
            }
        }
        path_to_leaf.delete_v();
    }